

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winmakefile.cpp
# Opt level: O3

void __thiscall
Win32MakefileGenerator::writeObjectsPart(Win32MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  QTextStream *pQVar1;
  ProStringList *paths;
  long in_FS_OFFSET;
  ProKey local_88;
  QArrayDataPointer<ProString> local_58;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (QTextStream *)QTextStream::operator<<(t,"OBJECTS       = ");
  this_00 = (this->super_MakefileGenerator).project;
  ProKey::ProKey(&local_88,anon_var_dwarf_143342);
  paths = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&local_88);
  MakefileGenerator::escapeDependencyPaths
            ((ProStringList *)&local_58,&this->super_MakefileGenerator,paths);
  MakefileGenerator::valList(&local_40,&this->super_MakefileGenerator,(ProStringList *)&local_58);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,(QString *)&local_40);
  Qt::endl(pQVar1);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  if (&(local_88.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Win32MakefileGenerator::writeObjectsPart(QTextStream &t)
{
    // Used in both deps and commands.
    t << "OBJECTS       = " << valList(escapeDependencyPaths(project->values("OBJECTS"))) << Qt::endl;
}